

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

seconds32 __thiscall libtorrent::aux::torrent::active_time(torrent *this)

{
  int iVar1;
  time_point tVar2;
  
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0) {
    tVar2 = time_now();
    iVar1 = (int)(((long)tVar2.__d.__r + (long)(this->m_started).__d.__r * -1000000000) / 1000000000
                 ) + (this->m_active_time).__r;
  }
  else {
    iVar1 = (this->m_active_time).__r;
  }
  return (seconds32)iVar1;
}

Assistant:

seconds32 torrent::active_time() const
	{
		if (is_paused())
			return m_active_time;

		// m_active_time does not account for the current "session", just the
		// time before we last started this torrent. To get the current time, we
		// need to add the time since we started it
		return m_active_time + duration_cast<seconds32>(
			aux::time_now() - m_started);
	}